

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall sjtu::index_out_of_bound::index_out_of_bound(index_out_of_bound *this)

{
  undefined8 *in_RDI;
  exception *in_stack_00000010;
  
  exception::exception(in_stack_00000010);
  *in_RDI = &PTR_what_abi_cxx11__001378f8;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"index_out_of_bound");
  return;
}

Assistant:

index_out_of_bound() {
	    wro = "index_out_of_bound";
	}